

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O3

void sg_init_image(sg_image img_id,sg_image_desc *desc)

{
  _sg_image_t *img;
  sg_image_desc desc_def;
  sg_image_desc sStack_6a8;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x3e06,"void sg_init_image(sg_image, const sg_image_desc *)");
  }
  _sg_image_desc_defaults(&sStack_6a8,desc);
  if (img_id.id != 0) {
    img = _sg_image_at((_sg_pools_t *)(ulong)img_id.id,(uint32_t)desc);
    if ((img->slot).id == img_id.id) {
      if ((img->slot).state != SG_RESOURCESTATE_ALLOC) {
        if (_sg.desc.logger.log_cb != (_func_void_char_ptr_void_ptr *)0x0) {
          (*_sg.desc.logger.log_cb)
                    ("sg_init_image: image must be in alloc state\n",_sg.desc.logger.user_data);
          return;
        }
        puts("sg_init_image: image must be in alloc state\n");
        return;
      }
      _sg_init_image(img,&sStack_6a8);
      if (((img->slot).state & ~SG_RESOURCESTATE_ALLOC) != SG_RESOURCESTATE_VALID) {
        __assert_fail("(img->slot.state == SG_RESOURCESTATE_VALID) || (img->slot.state == SG_RESOURCESTATE_FAILED)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                      ,0x3e0c,"void sg_init_image(sg_image, const sg_image_desc *)");
      }
    }
  }
  return;
}

Assistant:

inline void sg_init_image(sg_image img_id, const sg_image_desc& desc) { return sg_init_image(img_id, &desc); }